

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t coda_strispn(char *s,char *n)

{
  char cVar1;
  char cVar2;
  __int32_t **pp_Var3;
  char *pcVar4;
  char *pcVar5;
  
  for (pcVar5 = s; cVar1 = *pcVar5, pcVar4 = n, (long)cVar1 != 0; pcVar5 = pcVar5 + 1) {
    do {
      cVar2 = *pcVar4;
      if ((long)cVar2 == 0) goto LAB_001061ab;
      pp_Var3 = __ctype_tolower_loc();
      pcVar4 = pcVar4 + 1;
    } while ((*pp_Var3)[cVar1] != (*pp_Var3)[cVar2]);
  }
LAB_001061ab:
  return (long)pcVar5 - (long)s;
}

Assistant:

size_t coda_strispn(const char *s, const char *n)
{
	const char *p = s;
	const char *x;

	for (; *p; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}

		if (!*x) break;
	}

	return p - s;
}